

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_object_impl.hpp
# Opt level: O0

io_object_impl<asio::detail::reactive_socket_service<asio::ip::tcp>,_asio::any_io_executor> *
__thiscall
asio::detail::
io_object_impl<asio::detail::reactive_socket_service<asio::ip::tcp>,_asio::any_io_executor>::
operator=(io_object_impl<asio::detail::reactive_socket_service<asio::ip::tcp>,_asio::any_io_executor>
          *this,io_object_impl<asio::detail::reactive_socket_service<asio::ip::tcp>,_asio::any_io_executor>
                *other)

{
  io_object_impl<asio::detail::reactive_socket_service<asio::ip::tcp>,_asio::any_io_executor>
  *in_RSI;
  io_object_impl<asio::detail::reactive_socket_service<asio::ip::tcp>,_asio::any_io_executor>
  *in_RDI;
  implementation_type *in_stack_00000018;
  reactive_socket_service<asio::ip::tcp> *in_stack_00000020;
  
  if (in_RDI != in_RSI) {
    reactive_socket_service<asio::ip::tcp>::move_assign
              (in_stack_00000020,in_stack_00000018,(reactive_socket_service_base *)this,
               (implementation_type *)other);
    any_io_executor::~any_io_executor((any_io_executor *)0x1d2170);
    any_io_executor::any_io_executor((any_io_executor *)in_RSI,(any_io_executor *)in_RDI);
    in_RDI->service_ = in_RSI->service_;
  }
  return in_RDI;
}

Assistant:

io_object_impl& operator=(io_object_impl&& other)
  {
    if (this != &other)
    {
      service_->move_assign(implementation_,
          *other.service_, other.implementation_);
      executor_.~executor_type();
      new (&executor_) executor_type(other.executor_);
      service_ = other.service_;
    }
    return *this;
  }